

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

matrix3 * matrix3_inverse(matrix3 *self,matrix3 *mR)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double local_58 [9];
  
  dVar10 = matrix3_determinant(self);
  dVar11 = -dVar10;
  if (-dVar10 <= dVar10) {
    dVar11 = dVar10;
  }
  if (dVar11 < 1e-05) {
    mR = (matrix3 *)0x0;
  }
  else {
    dVar11 = (self->field_0).m[4];
    dVar1 = (self->field_0).m[1];
    dVar3 = (self->field_0).m[7];
    dVar4 = (self->field_0).m[8];
    dVar5 = (self->field_0).m[5];
    dVar6 = (self->field_0).m[6];
    dVar7 = (self->field_0).m[2];
    dVar8 = (self->field_0).m[3];
    local_58[0] = dVar11 * dVar4 - dVar5 * dVar3;
    local_58[1] = dVar7 * dVar3 - dVar4 * dVar1;
    local_58[2] = dVar1 * dVar5 - dVar11 * dVar7;
    local_58[3] = dVar5 * dVar6 - dVar4 * dVar8;
    dVar2 = (self->field_0).m[0];
    local_58[4] = dVar2 * dVar4 - dVar7 * dVar6;
    local_58[5] = dVar8 * dVar7 - dVar5 * dVar2;
    local_58[6] = dVar8 * dVar3 - dVar11 * dVar6;
    local_58[7] = dVar6 * dVar1 - dVar3 * dVar2;
    local_58[8] = dVar2 * dVar11 - dVar8 * dVar1;
    for (lVar9 = 0; lVar9 != 9; lVar9 = lVar9 + 1) {
      (mR->field_0).m[lVar9] = local_58[lVar9] * (1.0 / dVar10);
    }
  }
  return mR;
}

Assistant:

HYPAPI struct matrix3 *matrix3_inverse(const struct matrix3 *self, struct matrix3 *mR)
{
	struct matrix3 inverse;
	HYP_FLOAT determinant;
	uint8_t i;

	determinant = matrix3_determinant(self);

	/* calculated early for a quick exit if no determinant exists */
	if (scalar_equalsf(determinant, 0.0f)) {
		return NULL;
	}

	determinant = 1.0f / determinant;

	matrix3_identity(&inverse);

	/* find the adjugate of self */
	B(11) = A2(22, 33) - A2(32, 23);
	B(12) = A2(32, 13) - A2(12, 33);
	B(13) = A2(12, 23) - A2(22, 13);

	B(21) = A2(23, 31) - A2(33, 21);
	B(22) = A2(33, 11) - A2(13, 31);
	B(23) = A2(13, 21) - A2(23, 11);

	B(31) = A2(21, 32) - A2(31, 22);
	B(32) = A2(31, 12) - A2(11, 32);
	B(33) = A2(11, 22) - A2(21, 12);

	/* divide the determinant */
	for (i = 0; i < 9; i++) {
		mR->m[i] = inverse.m[i] * determinant;
	}

	return mR;
}